

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::Decode
          (Underwater_Acoustic_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT8 *pKVar1;
  KUINT8 *pKVar2;
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
  *this_00;
  KUINT16 KVar3;
  KException *this_01;
  int iVar4;
  undefined7 in_register_00000011;
  byte bVar5;
  allocator<char> local_99;
  KUINT8 *local_98;
  KUINT8 *local_90;
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
  *local_88;
  Shaft sft;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (0x1f < iVar4 + (uint)KVar3) {
    Header7::Decode(&this->super_Header,stream,ignoreHeader);
    (*(this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3]
    )(&this->m_EmittingEntityID,stream);
    (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EventID,stream);
    KDataStream::Read(stream,&this->m_ui8StateUpdateIndicator);
    KDataStream::Read(stream,&this->m_ui8Padding1);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16PassiveParamIndex);
    KDataStream::Read(stream,&this->m_ui8PropPlantConfig);
    KDataStream::Read(stream,&this->m_ui8NumShafts);
    local_90 = &this->m_ui8NumAPA;
    KDataStream::Read(stream,local_90);
    local_98 = &this->m_ui8NumEmitterSys;
    KDataStream::Read(stream,local_98);
    std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::clear
              (&this->m_vShafts);
    std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::clear(&this->m_vAPA);
    local_88 = &this->m_vUAES;
    std::
    vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
    ::clear(local_88);
    for (bVar5 = 0; this_00 = local_88, pKVar2 = local_90, bVar5 < this->m_ui8NumShafts;
        bVar5 = bVar5 + 1) {
      DATA_TYPE::Shaft::Shaft(&sft);
      (*sft.super_DataTypeBase._vptr_DataTypeBase[3])(&sft,stream);
      std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::push_back
                (&this->m_vShafts,&sft);
      DATA_TYPE::Shaft::~Shaft(&sft);
    }
    for (bVar5 = 0; pKVar1 = local_98, bVar5 < *pKVar2; bVar5 = bVar5 + 1) {
      DATA_TYPE::APA::APA((APA *)&sft);
      (*sft.super_DataTypeBase._vptr_DataTypeBase[3])(&sft,stream);
      std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::push_back
                (&this->m_vAPA,(value_type *)&sft);
      DATA_TYPE::DataTypeBase::~DataTypeBase(&sft.super_DataTypeBase);
    }
    for (bVar5 = 0; bVar5 < *pKVar1; bVar5 = bVar5 + 1) {
      DATA_TYPE::UnderwaterAcousticEmitterSystem::UnderwaterAcousticEmitterSystem
                ((UnderwaterAcousticEmitterSystem *)&sft);
      (*sft.super_DataTypeBase._vptr_DataTypeBase[3])
                ((UnderwaterAcousticEmitterSystem *)&sft,stream);
      std::
      vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
      ::push_back(this_00,(UnderwaterAcousticEmitterSystem *)&sft);
      DATA_TYPE::UnderwaterAcousticEmitterSystem::~UnderwaterAcousticEmitterSystem
                ((UnderwaterAcousticEmitterSystem *)&sft);
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&sft,"Decode",&local_99);
  KException::KException(this_01,(KString *)&sft,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void Underwater_Acoustic_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < UNDERWATER_ACOUSTIC_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EmittingEntityID
           >> KDIS_STREAM m_EventID
           >> m_ui8StateUpdateIndicator
           >> m_ui8Padding1
           >> m_ui16PassiveParamIndex
           >> m_ui8PropPlantConfig
           >> m_ui8NumShafts
           >> m_ui8NumAPA
           >> m_ui8NumEmitterSys;

    m_vShafts.clear();
    m_vAPA.clear();
    m_vUAES.clear();

    for( KUINT8 i = 0; i < m_ui8NumShafts; ++i )
    {
        Shaft sft;
        stream >> KDIS_STREAM sft;
        m_vShafts.push_back( sft );
    }

    for( KUINT8 i = 0; i < m_ui8NumAPA; ++i )
    {
        APA apa;
        stream >> KDIS_STREAM apa;
        m_vAPA.push_back( apa );
    }

    for( KUINT8 i = 0; i < m_ui8NumEmitterSys; ++i )
    {
        UnderwaterAcousticEmitterSystem uaes;
        stream >> KDIS_STREAM uaes;
        m_vUAES.push_back( uaes );
    }
}